

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiTextFilter::Build(ImGuiTextFilter *this)

{
  ImVector<ImGuiTextFilter::ImGuiTextRange> *this_00;
  size_t sVar1;
  ImGuiTextRange *pIVar2;
  char *pcVar3;
  char *pcVar4;
  int i;
  int i_00;
  ImGuiTextRange input_range;
  char *pcVar5;
  
  this_00 = &this->Filters;
  ImVector<ImGuiTextFilter::ImGuiTextRange>::resize(this_00,0);
  sVar1 = strlen(this->InputBuf);
  input_range.e = this->InputBuf + sVar1;
  input_range.b = this->InputBuf;
  ImGuiTextRange::split(&input_range,',',this_00);
  this->CountGrep = 0;
  for (i_00 = 0; i_00 != this_00->Size; i_00 = i_00 + 1) {
    pIVar2 = ImVector<ImGuiTextFilter::ImGuiTextRange>::operator[](this_00,i_00);
    pcVar3 = pIVar2->b;
    pcVar5 = pIVar2->e;
    while ((pcVar3 < pcVar5 && ((*pcVar3 == ' ' || (*pcVar3 == '\t'))))) {
      pcVar3 = pcVar3 + 1;
      pIVar2->b = pcVar3;
    }
    while ((pcVar4 = pcVar5 + -1, pcVar3 < pcVar5 && ((*pcVar4 == ' ' || (*pcVar4 == '\t'))))) {
      pIVar2->e = pcVar4;
      pcVar5 = pcVar4;
    }
    if (pcVar5 != pcVar3) {
      pIVar2 = ImVector<ImGuiTextFilter::ImGuiTextRange>::operator[](this_00,i_00);
      if (*pIVar2->b != '-') {
        this->CountGrep = this->CountGrep + 1;
      }
    }
  }
  return;
}

Assistant:

void ImGuiTextFilter::Build()
{
    Filters.resize(0);
    ImGuiTextRange input_range(InputBuf, InputBuf+strlen(InputBuf));
    input_range.split(',', &Filters);

    CountGrep = 0;
    for (int i = 0; i != Filters.Size; i++)
    {
        ImGuiTextRange& f = Filters[i];
        while (f.b < f.e && ImCharIsBlankA(f.b[0]))
            f.b++;
        while (f.e > f.b && ImCharIsBlankA(f.e[-1]))
            f.e--;
        if (f.empty())
            continue;
        if (Filters[i].b[0] != '-')
            CountGrep += 1;
    }
}